

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cc
# Opt level: O2

void __thiscall muduo::ThreadPool::runInThread(ThreadPool *this)

{
  Task task;
  Task local_40;
  
  if ((this->threadInitCallback_).super__Function_base._M_manager != (_Manager_type)0x0) {
    std::function<void_()>::operator()(&this->threadInitCallback_);
  }
  while (this->running_ == true) {
    take(&local_40,this);
    if (local_40.super__Function_base._M_manager != (_Manager_type)0x0) {
      std::function<void_()>::operator()(&local_40);
    }
    std::_Function_base::~_Function_base(&local_40.super__Function_base);
  }
  return;
}

Assistant:

void ThreadPool::runInThread()
{
  try
  {
    if (threadInitCallback_)
    {
      threadInitCallback_();
    }
    while (running_)
    {
      Task task(take());
      if (task)
      {
        task();
      }
    }
  }
  catch (const Exception& ex)
  {
    fprintf(stderr, "exception caught in ThreadPool %s\n", name_.c_str());
    fprintf(stderr, "reason: %s\n", ex.what());
    fprintf(stderr, "stack trace: %s\n", ex.stackTrace());
    abort();
  }
  catch (const std::exception& ex)
  {
    fprintf(stderr, "exception caught in ThreadPool %s\n", name_.c_str());
    fprintf(stderr, "reason: %s\n", ex.what());
    abort();
  }
  catch (...)
  {
    fprintf(stderr, "unknown exception caught in ThreadPool %s\n", name_.c_str());
    throw; // rethrow
  }
}